

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O0

void __thiscall crnlib::qdxt5::clear(qdxt5 *this)

{
  uint local_14;
  uint i;
  qdxt5 *this_local;
  
  this->m_main_thread_id = 0;
  this->m_num_blocks = 0;
  this->m_pBlocks = (dxt_pixel_block *)0x0;
  this->m_pDst_elements = (dxt5_block *)0x0;
  this->m_elements_per_block = 0;
  qdxt5_params::clear(&this->m_params);
  clusterizer<crnlib::vec<2U,_float>_>::clear(&this->m_endpoint_clusterizer);
  vector<crnlib::vector<unsigned_int>_>::clear(&this->m_endpoint_cluster_indices);
  this->m_max_selector_clusters = 0;
  this->m_canceled = false;
  this->m_progress_start = 0;
  this->m_progress_range = 100;
  threaded_clusterizer<crnlib::vec<16U,_float>_>::clear(&this->m_selector_clusterizer);
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    vector<crnlib::vector<unsigned_int>_>::clear(this->m_cached_selector_cluster_indices + local_14)
    ;
  }
  hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>
  ::clear(&this->m_cluster_hash);
  this->m_prev_percentage_complete = -1;
  return;
}

Assistant:

void qdxt5::clear()
    {
        m_main_thread_id = 0;
        m_num_blocks = 0;
        m_pBlocks = 0;
        m_pDst_elements = nullptr;
        m_elements_per_block = 0;
        m_params.clear();
        m_endpoint_clusterizer.clear();
        m_endpoint_cluster_indices.clear();
        m_max_selector_clusters = 0;
        m_canceled = false;
        m_progress_start = 0;
        m_progress_range = 100;
        m_selector_clusterizer.clear();

        for (uint i = 0; i <= qdxt5_params::cMaxQuality; i++)
        {
            m_cached_selector_cluster_indices[i].clear();
        }

        m_cluster_hash.clear();

        m_prev_percentage_complete = -1;
    }